

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_ip_hash_module.c
# Opt level: O0

ngx_int_t ngx_http_upstream_get_ip_hash_peer(ngx_peer_connection_t *pc,void *data)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *local_68;
  ngx_http_upstream_rr_peer_t *peer;
  ngx_uint_t hash;
  ngx_uint_t p;
  ngx_uint_t n;
  ngx_uint_t i;
  uintptr_t m;
  ngx_int_t w;
  time_t now;
  ngx_http_upstream_ip_hash_peer_data_t *iphp;
  void *data_local;
  ngx_peer_connection_t *pc_local;
  
  if ((pc->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pc->log,0,"get ip hash peer, try: %ui",pc->tries);
  }
  if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
    ngx_rwlock_wlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
  }
  if ((*(byte *)((long)data + 0x40) < 0x15) &&
     ((*(byte *)(*(long *)((long)data + 8) + 0x28) & 1) == 0)) {
    lVar1 = ngx_cached_time->sec;
    pc->field_0x68 = pc->field_0x68 & 0xfe;
    pc->connection = (ngx_connection_t *)0x0;
    peer = *(ngx_http_upstream_rr_peer_t **)((long)data + 0x28);
    do {
      for (n = 0; n < *(byte *)((long)data + 0x30); n = n + 1) {
        peer = (ngx_http_upstream_rr_peer_t *)
               (((long)peer * 0x71 + (ulong)*(byte *)(*(long *)((long)data + 0x38) + n)) % 0x187f);
      }
      m = (ulong)peer % *(ulong *)(*(long *)((long)data + 8) + 0x20);
      local_68 = *(undefined8 **)(*(long *)((long)data + 8) + 0x40);
      hash = 0;
      for (; (long)local_68[8] <= (long)m; local_68 = (undefined8 *)local_68[0x14]) {
        m = m - local_68[8];
        hash = hash + 1;
      }
      uVar3 = hash >> 6;
      uVar4 = 1L << ((byte)hash & 0x3f);
      if ((*(ulong *)(*(long *)((long)data + 0x18) + uVar3 * 8) & uVar4) == 0) {
        if ((pc->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pc->log,0,"get ip hash peer, hash: %ui %04XL",hash,uVar4);
        }
        if (((local_68[0x12] == 0) &&
            (((local_68[0xe] == 0 || ((ulong)local_68[0xb] < (ulong)local_68[0xe])) ||
             ((long)local_68[0xf] < lVar1 - local_68[0xd])))) &&
           ((local_68[10] == 0 || ((ulong)local_68[9] < (ulong)local_68[10])))) {
          *(undefined8 **)((long)data + 0x10) = local_68;
          pc->sockaddr = (sockaddr *)*local_68;
          pc->socklen = *(socklen_t *)(local_68 + 1);
          pc->name = (ngx_str_t *)(local_68 + 2);
          local_68[9] = local_68[9] + 1;
          if ((long)local_68[0xf] < lVar1 - local_68[0xd]) {
            local_68[0xd] = lVar1;
          }
          if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
            ngx_rwlock_unlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
          }
          *(ulong *)(*(long *)((long)data + 0x18) + uVar3 * 8) =
               uVar4 | *(ulong *)(*(long *)((long)data + 0x18) + uVar3 * 8);
          *(ngx_http_upstream_rr_peer_t **)((long)data + 0x28) = peer;
          return 0;
        }
      }
      bVar2 = *(char *)((long)data + 0x40) + 1;
      *(byte *)((long)data + 0x40) = bVar2;
    } while (bVar2 < 0x15);
    if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
      ngx_rwlock_unlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
    }
    pc_local = (ngx_peer_connection_t *)(**(code **)((long)data + 0x48))(pc,data);
  }
  else {
    if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
      ngx_rwlock_unlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
    }
    pc_local = (ngx_peer_connection_t *)(**(code **)((long)data + 0x48))(pc,data);
  }
  return (ngx_int_t)pc_local;
}

Assistant:

static ngx_int_t
ngx_http_upstream_get_ip_hash_peer(ngx_peer_connection_t *pc, void *data)
{
    ngx_http_upstream_ip_hash_peer_data_t  *iphp = data;

    time_t                        now;
    ngx_int_t                     w;
    uintptr_t                     m;
    ngx_uint_t                    i, n, p, hash;
    ngx_http_upstream_rr_peer_t  *peer;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "get ip hash peer, try: %ui", pc->tries);

    /* TODO: cached */

    ngx_http_upstream_rr_peers_wlock(iphp->rrp.peers);

    if (iphp->tries > 20 || iphp->rrp.peers->single) {
        ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);
        return iphp->get_rr_peer(pc, &iphp->rrp);
    }

    now = ngx_time();

    pc->cached = 0;
    pc->connection = NULL;

    hash = iphp->hash;

    for ( ;; ) {

        for (i = 0; i < (ngx_uint_t) iphp->addrlen; i++) {
            hash = (hash * 113 + iphp->addr[i]) % 6271;
        }

        w = hash % iphp->rrp.peers->total_weight;
        peer = iphp->rrp.peers->peer;
        p = 0;

        while (w >= peer->weight) {
            w -= peer->weight;
            peer = peer->next;
            p++;
        }

        n = p / (8 * sizeof(uintptr_t));
        m = (uintptr_t) 1 << p % (8 * sizeof(uintptr_t));

        if (iphp->rrp.tried[n] & m) {
            goto next;
        }

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                       "get ip hash peer, hash: %ui %04XL", p, (uint64_t) m);

        if (peer->down) {
            goto next;
        }

        if (peer->max_fails
            && peer->fails >= peer->max_fails
            && now - peer->checked <= peer->fail_timeout)
        {
            goto next;
        }

        if (peer->max_conns && peer->conns >= peer->max_conns) {
            goto next;
        }

        break;

    next:

        if (++iphp->tries > 20) {
            ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);
            return iphp->get_rr_peer(pc, &iphp->rrp);
        }
    }

    iphp->rrp.current = peer;

    pc->sockaddr = peer->sockaddr;
    pc->socklen = peer->socklen;
    pc->name = &peer->name;

    peer->conns++;

    if (now - peer->checked > peer->fail_timeout) {
        peer->checked = now;
    }

    ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);

    iphp->rrp.tried[n] |= m;
    iphp->hash = hash;

    return NGX_OK;
}